

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
ModsGameCommand::trigger
          (ModsGameCommand *this,Server *source,PlayerInfo *param_2,string_view param_3)

{
  Server *pSVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Alloc_hider args_1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  Server *pSVar5;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Server *local_68;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  string_view staff_word;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)param_3._M_str;
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  staff_word._M_len = pluginInstance.m_staffTitle._M_string_length;
  staff_word._M_str = pluginInstance.m_staffTitle._M_dataplus._M_p;
  args_1._M_p = pluginInstance.m_staffTitle._M_dataplus._M_p;
  pSVar5 = source + 0x10;
  local_68 = source;
  while (pSVar1 = local_68, pSVar5 = *(Server **)pSVar5, pSVar5 != source + 0x10) {
    if ((pSVar5[0x110] == (Server)0x0) &&
       ((*(long *)(pSVar5 + 0x60) != 0 ||
        ((*(int *)(pSVar5 + 0x1c0) != 0 &&
         ((*(long *)(pSVar5 + 0x188) != 0 || (*(long *)(pSVar5 + 0x1a8) != 0)))))))) {
      if (msg._M_string_length == 0) {
        local_60._M_len = 0xb;
        local_60._M_str = "s in-game: ";
        jessilib::
        join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
                  (&local_88,(jessilib *)&staff_word,&local_60,
                   (basic_string_view<char,_std::char_traits<char>_> *)args_1._M_p);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&msg,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&msg,", ");
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (pSVar5 + 0x180));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (pSVar5 + 0x18));
    }
  }
  if (msg._M_string_length == 0) {
    local_60._M_len = 3;
    local_60._M_str = "No ";
    local_40._M_len = 0xd;
    local_40._M_str = "s are in-game";
    jessilib::
    join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
              (&local_88,(jessilib *)&local_60,&staff_word,&local_40,args_2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&msg,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    uVar2 = RenX::Server::getCommand(pSVar1,10,"modrequest");
    if (uVar2 == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&msg,'.');
    }
    else {
      uVar3 = RenX::Server::getCommandPrefix();
      RenX::Server::getCommandPrefix();
      uVar4 = Jupiter::Command::getTrigger(uVar2);
      Jupiter::Command::getTrigger(uVar2);
      string_printf_abi_cxx11_
                (&local_88,"; please use \"%.*s%.*s\" if you require assistance.",uVar3,extraout_RDX
                 ,uVar4,extraout_RDX_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&msg,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  RenX::Server::sendMessage(pSVar1,msg._M_string_length,msg._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void MsgIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		int type = source->getChannel(channel)->getType();
		std::string msg;
		char prefix = source->getChannel(channel)->getUserPrefix(nick);
		if (prefix != '\0')
			msg += prefix;
		msg += nick;
		msg += "@IRC: ";
		msg += parameters;

		prefix = '\0'; // Reusing prefix to check if a match is ever found.
		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
		{
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type))
			{
				server->sendMessage(msg);
				prefix = 1;
			}
		}
		if (prefix == '\0')
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: Msg <Message>"sv);
}